

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrErr(xmlXPathParserContextPtr ctxt,int code,char *msg,xmlChar *extra)

{
  xmlXPathContextPtr pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlErrorPtr err;
  xmlNodePtr pxStack_58;
  int res;
  xmlNodePtr node;
  void *data;
  xmlStructuredErrorFunc serror;
  xmlChar *extra_local;
  char *msg_local;
  int code_local;
  xmlXPathParserContextPtr ctxt_local;
  
  data = (void *)0x0;
  node = (xmlNodePtr)0x0;
  pxStack_58 = (xmlNode *)0x0;
  if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->error == 0)) {
    ctxt->error = code;
    if (ctxt->context != (xmlXPathContextPtr)0x0) {
      pxVar1 = ctxt->context;
      xmlResetError(&pxVar1->lastError);
      (pxVar1->lastError).domain = 0xd;
      (pxVar1->lastError).code = code;
      (pxVar1->lastError).level = XML_ERR_ERROR;
      pxVar3 = xmlStrdup(ctxt->base);
      (pxVar1->lastError).str1 = (char *)pxVar3;
      if ((pxVar1->lastError).str1 == (char *)0x0) {
        xmlXPathPErrMemory(ctxt);
        return;
      }
      (pxVar1->lastError).int1 = (int)ctxt->cur - (int)ctxt->base;
      (pxVar1->lastError).node = ctxt->context->debugNode;
      data = ctxt->context->error;
      node = (xmlNodePtr)ctxt->context->userData;
      pxStack_58 = ctxt->context->debugNode;
    }
    iVar2 = xmlRaiseError((xmlStructuredErrorFunc)data,(xmlGenericErrorFunc)0x0,node,(void *)0x0,
                          pxStack_58,0xd,code,XML_ERR_ERROR,(char *)0x0,0,(char *)extra,
                          (char *)ctxt->base,(char *)0x0,(int)ctxt->cur - (int)ctxt->base,0,msg,
                          extra);
    if (iVar2 < 0) {
      xmlXPathPErrMemory(ctxt);
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlXPtrErr(xmlXPathParserContextPtr ctxt, int code,
           const char * msg, const xmlChar *extra)
{
    xmlStructuredErrorFunc serror = NULL;
    void *data = NULL;
    xmlNodePtr node = NULL;
    int res;

    if (ctxt == NULL)
        return;
    /* Only report the first error */
    if (ctxt->error != 0)
        return;

    ctxt->error = code;

    if (ctxt->context != NULL) {
        xmlErrorPtr err = &ctxt->context->lastError;

        /* cleanup current last error */
        xmlResetError(err);

        err->domain = XML_FROM_XPOINTER;
        err->code = code;
        err->level = XML_ERR_ERROR;
        err->str1 = (char *) xmlStrdup(ctxt->base);
        if (err->str1 == NULL) {
            xmlXPathPErrMemory(ctxt);
            return;
        }
        err->int1 = ctxt->cur - ctxt->base;
        err->node = ctxt->context->debugNode;

        serror = ctxt->context->error;
        data = ctxt->context->userData;
        node = ctxt->context->debugNode;
    }